

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O0

void __thiscall Vault::AppRoleStrategy::~AppRoleStrategy(AppRoleStrategy *this)

{
  AppRoleStrategy *this_local;
  
  (this->super_AuthenticationStrategy)._vptr_AuthenticationStrategy =
       (_func_int **)&PTR__AppRoleStrategy_0026d3f8;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&this->mount_);
  Tiny<Vault::SecretIdDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&this->secretId_);
  Tiny<Vault::RoleIdDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&this->roleId_);
  AuthenticationStrategy::~AuthenticationStrategy(&this->super_AuthenticationStrategy);
  return;
}

Assistant:

explicit AppRoleStrategy(RoleId roleId, SecretId secretId)
      : roleId_(std::move(roleId)), secretId_(std::move(secretId)),
        mount_(Path{"approle"}) {}